

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::NavCalcPreferredRefPos(void)

{
  ImGuiWindow *window_00;
  ImGuiContext *pIVar1;
  float fVar2;
  bool bVar3;
  ImVec2 *lhs;
  float fVar4;
  float fVar5;
  float rhs;
  float fVar6;
  ImVec2 mx;
  ImVec2 *local_70;
  ImVec2 local_60;
  ImGuiViewport *local_58;
  ImGuiViewport *viewport;
  ImVec2 pos;
  ImVec2 local_40;
  ImVec2 next_scroll;
  ImRect rect_rel;
  ImVec2 p;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  window_00 = GImGui->NavWindow;
  if ((((GImGui->NavDisableHighlight & 1U) == 0) && ((GImGui->NavDisableMouseHover & 1U) != 0)) &&
     (window_00 != (ImGuiWindow *)0x0)) {
    _next_scroll = WindowRectRelToAbs(window_00,window_00->NavRectRel + GImGui->NavLayer);
    if ((window_00->LastFrameActive != pIVar1->FrameCount) &&
       (((fVar6 = (window_00->ScrollTarget).x, fVar6 != 3.4028235e+38 || (NAN(fVar6))) ||
        ((fVar6 = (window_00->ScrollTarget).y, fVar6 != 3.4028235e+38 || (NAN(fVar6))))))) {
      local_40 = CalcNextScrollFromScrollTargetAndClamp(window_00);
      pos = ::operator-(&window_00->Scroll,&local_40);
      ImRect::Translate((ImRect *)&next_scroll,&pos);
    }
    fVar2 = next_scroll.x;
    fVar6 = (pIVar1->Style).FramePadding.x;
    fVar4 = ImRect::GetWidth((ImRect *)&next_scroll);
    fVar5 = ImMin<float>(fVar6 * 4.0,fVar4);
    fVar4 = rect_rel.Min.y;
    fVar6 = (pIVar1->Style).FramePadding.y;
    rhs = ImRect::GetHeight((ImRect *)&next_scroll);
    fVar6 = ImMin<float>(fVar6,rhs);
    ImVec2::ImVec2((ImVec2 *)&viewport,fVar2 + fVar5,fVar4 - fVar6);
    local_58 = GetMainViewport();
    lhs = &local_58->Pos;
    mx = operator+(lhs,&local_58->Size);
    local_60 = ImClamp((ImVec2 *)&viewport,lhs,mx);
    g = (ImGuiContext *)ImFloor(&local_60);
  }
  else {
    bVar3 = IsMousePosValid(&(GImGui->IO).MousePos);
    if (bVar3) {
      local_70 = &(pIVar1->IO).MousePos;
    }
    else {
      local_70 = &pIVar1->MouseLastValidPos;
    }
    rect_rel.Max.x = (*local_70).x;
    rect_rel.Max.y = (*local_70).y;
    ImVec2::ImVec2((ImVec2 *)&g,rect_rel.Max.x + 1.0,rect_rel.Max.y);
  }
  return (ImVec2)g;
}

Assistant:

static ImVec2 ImGui::NavCalcPreferredRefPos()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.NavWindow;
    if (g.NavDisableHighlight || !g.NavDisableMouseHover || !window)
    {
        // Mouse (we need a fallback in case the mouse becomes invalid after being used)
        // The +1.0f offset when stored by OpenPopupEx() allows reopening this or another popup (same or another mouse button) while not moving the mouse, it is pretty standard.
        // In theory we could move that +1.0f offset in OpenPopupEx()
        ImVec2 p = IsMousePosValid(&g.IO.MousePos) ? g.IO.MousePos : g.MouseLastValidPos;
        return ImVec2(p.x + 1.0f, p.y);
    }
    else
    {
        // When navigation is active and mouse is disabled, pick a position around the bottom left of the currently navigated item
        // Take account of upcoming scrolling (maybe set mouse pos should be done in EndFrame?)
        ImRect rect_rel = WindowRectRelToAbs(window, window->NavRectRel[g.NavLayer]);
        if (window->LastFrameActive != g.FrameCount && (window->ScrollTarget.x != FLT_MAX || window->ScrollTarget.y != FLT_MAX))
        {
            ImVec2 next_scroll = CalcNextScrollFromScrollTargetAndClamp(window);
            rect_rel.Translate(window->Scroll - next_scroll);
        }
        ImVec2 pos = ImVec2(rect_rel.Min.x + ImMin(g.Style.FramePadding.x * 4, rect_rel.GetWidth()), rect_rel.Max.y - ImMin(g.Style.FramePadding.y, rect_rel.GetHeight()));
        ImGuiViewport* viewport = GetMainViewport();
        return ImFloor(ImClamp(pos, viewport->Pos, viewport->Pos + viewport->Size)); // ImFloor() is important because non-integer mouse position application in backend might be lossy and result in undesirable non-zero delta.
    }
}